

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPath.c
# Opt level: O1

Vec_Wec_t * Abc_GraphFrontiers(Vec_Int_t *vEdges,Vec_Int_t *vLife)

{
  uint uVar1;
  int *piVar2;
  long lVar3;
  Vec_Wec_t *p;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Vec_Int_t *p_00;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int *piVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  bool bVar14;
  
  iVar13 = vEdges->nSize / 2;
  p = (Vec_Wec_t *)malloc(0x10);
  iVar6 = 8;
  if (6 < iVar13 - 1U) {
    iVar6 = iVar13;
  }
  p->nSize = 0;
  p->nCap = iVar6;
  if (iVar6 == 0) {
    pVVar4 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar4 = (Vec_Int_t *)calloc((long)iVar6,0x10);
  }
  p->pArray = pVVar4;
  iVar13 = vLife->nSize / 2;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar13 - 1U) {
    iVar6 = iVar13;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar6;
  if (iVar6 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar6 << 2);
  }
  pVVar4->pArray = piVar5;
  Vec_WecPushLevel(p);
  iVar6 = vEdges->nSize;
  if (1 < iVar6) {
    uVar8 = 0;
    do {
      if ((long)iVar6 <= (long)(uVar8 * 2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      piVar5 = vEdges->pArray;
      lVar12 = 0;
      do {
        iVar6 = piVar5[uVar8 * 2 + lVar12];
        if (iVar6 < 0) {
LAB_004920d0:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar9 = iVar6 * 2;
        uVar1 = vLife->nSize;
        if (uVar1 == uVar9 || SBORROW4(uVar1,uVar9) != (int)(uVar1 + iVar6 * -2) < 0)
        goto LAB_004920d0;
        if (uVar8 == (uint)vLife->pArray[uVar9]) {
          Vec_IntPush(pVVar4,iVar6);
        }
        else {
          if ((int)uVar1 <= (int)(uVar9 | 1)) goto LAB_004920d0;
          if (uVar8 == (uint)vLife->pArray[uVar9 | 1]) {
            uVar1 = pVVar4->nSize;
            uVar7 = 0;
            bVar14 = 0 < (int)uVar1;
            if (0 < (int)uVar1) {
              bVar14 = true;
              if (*pVVar4->pArray != iVar6) {
                uVar11 = 0;
                do {
                  if ((ulong)uVar1 - 1 == uVar11) {
                    bVar14 = false;
                    uVar7 = (ulong)uVar1;
                    goto LAB_00491ff7;
                  }
                  uVar7 = uVar11 + 1;
                  lVar3 = uVar11 + 1;
                  uVar11 = uVar7;
                } while (pVVar4->pArray[lVar3] != iVar6);
                bVar14 = uVar7 < uVar1;
              }
            }
LAB_00491ff7:
            if ((uint)uVar7 != uVar1) {
              if (!bVar14) {
                __assert_fail("i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
              }
              uVar9 = (uint)uVar7 + 1;
              if ((int)uVar9 < (int)uVar1) {
                piVar2 = pVVar4->pArray;
                piVar10 = piVar2 + uVar9;
                do {
                  iVar6 = (int)uVar7;
                  piVar2[uVar7 & 0xffffffff] = *piVar10;
                  piVar10 = piVar10 + 1;
                  uVar7 = (ulong)(iVar6 + 1);
                } while (iVar6 + 2 < (int)uVar1);
              }
              pVVar4->nSize = uVar1 - 1;
            }
          }
        }
        bVar14 = lVar12 == 0;
        lVar12 = lVar12 + 1;
      } while (bVar14);
      p_00 = Vec_WecPushLevel(p);
      iVar6 = pVVar4->nSize;
      if (0 < (long)iVar6) {
        piVar5 = pVVar4->pArray;
        lVar12 = 0;
        do {
          Vec_IntPush(p_00,piVar5[lVar12]);
          lVar12 = lVar12 + 1;
        } while (iVar6 != lVar12);
      }
      uVar8 = uVar8 + 1;
      iVar6 = vEdges->nSize;
    } while ((long)uVar8 < (long)(iVar6 / 2));
  }
  if (pVVar4->pArray != (int *)0x0) {
    free(pVVar4->pArray);
    pVVar4->pArray = (int *)0x0;
  }
  free(pVVar4);
  return p;
}

Assistant:

Vec_Wec_t * Abc_GraphFrontiers( Vec_Int_t * vEdges, Vec_Int_t * vLife )
{
    Vec_Wec_t * vFronts = Vec_WecAlloc( Vec_IntSize(vEdges)/2 ); // front for each edge
    Vec_Int_t * vTemp = Vec_IntAlloc( Vec_IntSize(vLife)/2 );
    int e, n;    
    Vec_WecPushLevel(vFronts);
    for ( e = 0; e < Vec_IntSize(vEdges)/2; e++ )
    {
        int * pNodes = Vec_IntEntryP(vEdges, 2*e);
        for ( n = 0; n < 2; n++ )
            if ( Vec_IntEntry(vLife, 2*pNodes[n]) == e ) // first time
                Vec_IntPush( vTemp, pNodes[n] );
            else if ( Vec_IntEntry(vLife, 2*pNodes[n]+1) == e ) // last time
                Vec_IntRemove( vTemp, pNodes[n] );
        Vec_IntAppend( Vec_WecPushLevel(vFronts), vTemp );
    }
    //Vec_WecPrint( vFronts, 0 );
    Vec_IntFree( vTemp );
    return vFronts;
}